

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerHLSL::is_user_type_structured(CompilerHLSL *this,uint32_t id)

{
  int iVar1;
  bool local_39;
  ID local_2c;
  string *local_28;
  string *user_type;
  CompilerHLSL *pCStack_18;
  uint32_t id_local;
  CompilerHLSL *this_local;
  
  if (((this->hlsl_options).preserve_structured_buffers & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    user_type._4_4_ = id;
    pCStack_18 = this;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,id);
    local_28 = Compiler::get_decoration_string_abi_cxx11_
                         ((Compiler *)this,local_2c,DecorationUserTypeGOOGLE);
    iVar1 = ::std::__cxx11::string::compare((ulong)local_28,0,(char *)0x10);
    local_39 = true;
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((ulong)local_28,0,(char *)0x12);
      local_39 = true;
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((ulong)local_28,0,(char *)0x21);
        local_39 = iVar1 == 0;
      }
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerHLSL::is_user_type_structured(uint32_t id) const
{
	if (hlsl_options.preserve_structured_buffers)
	{
		// Compare left hand side of string only as these user types can contain more meta data such as their subtypes,
		// e.g. "structuredbuffer:int"
		const std::string &user_type = get_decoration_string(id, DecorationUserTypeGOOGLE);
		return user_type.compare(0, 16, "structuredbuffer") == 0 ||
		       user_type.compare(0, 18, "rwstructuredbuffer") == 0 ||
		       user_type.compare(0, 33, "rasterizerorderedstructuredbuffer") == 0;
	}
	return false;
}